

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_seed_tet(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT *tet)

{
  REF_CELL pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  REF_INT local_10c;
  double local_108;
  double local_100;
  double local_f8;
  REF_INT local_ec;
  int local_e8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL subtetvol;
  REF_DBL vol;
  REF_INT nodes [27];
  int local_54;
  double dStack_50;
  REF_INT cell_face;
  REF_DBL best_vol;
  REF_INT local_40;
  REF_INT best_cell;
  REF_INT cell;
  REF_INT item;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *tet_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->cell[8];
  ref_node_00 = ref_grid->node;
  *tet = -1;
  best_vol._4_4_ = -1;
  dStack_50 = -1e+200;
  if ((node0 < 0) || (pRVar1->ref_adj->nnode <= node0)) {
    local_e8 = -1;
  }
  else {
    local_e8 = pRVar1->ref_adj->first[node0];
  }
  best_cell = local_e8;
  if (local_e8 == -1) {
    local_ec = -1;
  }
  else {
    local_ec = pRVar1->ref_adj->item[local_e8].ref;
  }
  local_40 = local_ec;
  do {
    if (best_cell == -1) {
      if (best_vol._4_4_ == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x357,"ref_layer_seed_tet","best tet empty");
        ref_grid_local._4_4_ = 1;
      }
      else if (0.0 < dStack_50) {
        *tet = best_vol._4_4_;
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x358,"ref_layer_seed_tet","best vol not positive");
        ref_grid_local._4_4_ = 1;
      }
      return ref_grid_local._4_4_;
    }
    for (local_54 = 0; local_54 < pRVar1->face_per; local_54 = local_54 + 1) {
      if (((node0 != pRVar1->c2n[pRVar1->f2n[local_54 << 2] + pRVar1->size_per * local_40]) &&
          (node0 != pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 1] + pRVar1->size_per * local_40])) &&
         (node0 != pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 2] + pRVar1->size_per * local_40])) {
        subtetvol = 1e+200;
        nodes[0] = pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 1] + pRVar1->size_per * local_40];
        nodes[1] = pRVar1->c2n[pRVar1->f2n[local_54 << 2] + pRVar1->size_per * local_40];
        vol._0_4_ = node0;
        vol._4_4_ = node1;
        uVar2 = ref_node_tet_vol(ref_node_00,(REF_INT *)&vol,
                                 (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x343,"ref_layer_seed_tet",(ulong)uVar2,"vol");
          return uVar2;
        }
        if (_ref_private_macro_code_rss_1 <= subtetvol) {
          local_f8 = _ref_private_macro_code_rss_1;
        }
        else {
          local_f8 = subtetvol;
        }
        subtetvol = local_f8;
        nodes[0] = pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 2] + pRVar1->size_per * local_40];
        nodes[1] = pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 1] + pRVar1->size_per * local_40];
        vol._0_4_ = node0;
        vol._4_4_ = node1;
        uVar2 = ref_node_tet_vol(ref_node_00,(REF_INT *)&vol,
                                 (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x349,"ref_layer_seed_tet",(ulong)uVar2,"vol");
          return uVar2;
        }
        if (_ref_private_macro_code_rss_1 <= subtetvol) {
          local_100 = _ref_private_macro_code_rss_1;
        }
        else {
          local_100 = subtetvol;
        }
        subtetvol = local_100;
        nodes[0] = pRVar1->c2n[pRVar1->f2n[local_54 << 2] + pRVar1->size_per * local_40];
        nodes[1] = pRVar1->c2n[pRVar1->f2n[local_54 * 4 + 2] + pRVar1->size_per * local_40];
        vol._0_4_ = node0;
        vol._4_4_ = node1;
        uVar2 = ref_node_tet_vol(ref_node_00,(REF_INT *)&vol,
                                 (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x34f,"ref_layer_seed_tet",(ulong)uVar2,"vol");
          return uVar2;
        }
        if (_ref_private_macro_code_rss_1 <= subtetvol) {
          local_108 = _ref_private_macro_code_rss_1;
        }
        else {
          local_108 = subtetvol;
        }
        subtetvol = local_108;
        if (dStack_50 < local_108) {
          dStack_50 = local_108;
          best_vol._4_4_ = local_40;
        }
      }
    }
    best_cell = pRVar1->ref_adj->item[best_cell].next;
    if (best_cell == -1) {
      local_10c = -1;
    }
    else {
      local_10c = pRVar1->ref_adj->item[best_cell].ref;
    }
    local_40 = local_10c;
  } while( true );
}

Assistant:

static REF_FCN REF_STATUS ref_layer_seed_tet(REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_INT *tet) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT item, cell;
  REF_INT best_cell;
  REF_DBL best_vol;
  REF_INT cell_face, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL vol, subtetvol;
  *tet = REF_EMPTY;
  best_cell = REF_EMPTY;
  best_vol = -REF_DBL_MAX;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    each_ref_cell_cell_face(ref_cell, cell_face) {
      if (node0 == ref_cell_f2n(ref_cell, 0, cell_face, cell) ||
          node0 == ref_cell_f2n(ref_cell, 1, cell_face, cell) ||
          node0 == ref_cell_f2n(ref_cell, 2, cell_face, cell))
        continue;
      vol = REF_DBL_MAX;
      nodes[0] = node0;
      nodes[1] = node1;
      nodes[2] = ref_cell_f2n(ref_cell, 1, cell_face, cell);
      nodes[3] = ref_cell_f2n(ref_cell, 0, cell_face, cell);
      RSS(ref_node_tet_vol(ref_node, nodes, &subtetvol), "vol");
      vol = MIN(vol, subtetvol);
      nodes[0] = node0;
      nodes[1] = node1;
      nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell);
      nodes[3] = ref_cell_f2n(ref_cell, 1, cell_face, cell);
      RSS(ref_node_tet_vol(ref_node, nodes, &subtetvol), "vol");
      vol = MIN(vol, subtetvol);
      nodes[0] = node0;
      nodes[1] = node1;
      nodes[2] = ref_cell_f2n(ref_cell, 0, cell_face, cell);
      nodes[3] = ref_cell_f2n(ref_cell, 2, cell_face, cell);
      RSS(ref_node_tet_vol(ref_node, nodes, &subtetvol), "vol");
      vol = MIN(vol, subtetvol);
      if (vol > best_vol) {
        best_vol = vol;
        best_cell = cell;
      }
    }
  }
  RUS(REF_EMPTY, best_cell, "best tet empty");
  RAS(best_vol > 0, "best vol not positive");
  *tet = best_cell;
  return REF_SUCCESS;
}